

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

LoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          ExpressionSyntax *args_4,Token *args_5,StatementSyntax *args_6)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  LoopStatementSyntax *this_00;
  
  this_00 = (LoopStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LoopStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (LoopStatementSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar4 = args_2->kind;
  uVar5 = args_2->field_0x2;
  NVar6.raw = (args_2->numFlags).raw;
  uVar7 = args_2->rawLen;
  pIVar1 = args_2->info;
  TVar8 = args_3->kind;
  uVar9 = args_3->field_0x2;
  NVar10.raw = (args_3->numFlags).raw;
  uVar11 = args_3->rawLen;
  pIVar2 = args_3->info;
  TVar12 = args_5->kind;
  uVar13 = args_5->field_0x2;
  NVar14.raw = (args_5->numFlags).raw;
  uVar15 = args_5->rawLen;
  pIVar3 = args_5->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,LoopStatement,*args,args_1);
  (this_00->repeatOrWhile).kind = TVar4;
  (this_00->repeatOrWhile).field_0x2 = uVar5;
  (this_00->repeatOrWhile).numFlags = (NumericTokenFlags)NVar6.raw;
  (this_00->repeatOrWhile).rawLen = uVar7;
  (this_00->repeatOrWhile).info = pIVar1;
  (this_00->openParen).kind = TVar8;
  (this_00->openParen).field_0x2 = uVar9;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar10.raw;
  (this_00->openParen).rawLen = uVar11;
  (this_00->openParen).info = pIVar2;
  (this_00->expr).ptr = args_4;
  (this_00->closeParen).kind = TVar12;
  (this_00->closeParen).field_0x2 = uVar13;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (this_00->closeParen).rawLen = uVar15;
  (this_00->closeParen).info = pIVar3;
  (this_00->statement).ptr = args_6;
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }